

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::ModuleRunnerBase
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Module *wasm,
          ExternalInterface *externalInterface,
          map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
          *linkedInstances_)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_ExpressionRunner<wasm::ModuleRunner>).module = wasm;
  (this->super_ExpressionRunner<wasm::ModuleRunner>).maxDepth = 0;
  (this->super_ExpressionRunner<wasm::ModuleRunner>).depth = 0;
  (this->super_ExpressionRunner<wasm::ModuleRunner>).maxLoopIterations = 0;
  (this->super_ExpressionRunner<wasm::ModuleRunner>).relaxedBehavior = NonConstant;
  (this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner =
       (_func_int **)&PTR__ModuleRunnerBase_00161c10;
  this->wasm = wasm;
  p_Var1 = &(this->globals)._M_t._M_impl.super__Rb_tree_header;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->callDepth = 0;
  (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->droppedDataSegments)._M_h._M_buckets = &(this->droppedDataSegments)._M_h._M_single_bucket;
  (this->droppedDataSegments)._M_h._M_bucket_count = 1;
  (this->droppedDataSegments)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->droppedDataSegments)._M_h._M_element_count = 0;
  (this->droppedDataSegments)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->droppedDataSegments)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->droppedDataSegments)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->droppedElementSegments)._M_h._M_buckets =
       &(this->droppedElementSegments)._M_h._M_single_bucket;
  (this->droppedElementSegments)._M_h._M_bucket_count = 1;
  (this->droppedElementSegments)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->droppedElementSegments)._M_h._M_element_count = 0;
  (this->droppedElementSegments)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->droppedElementSegments)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->droppedElementSegments)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->memorySizes)._M_h._M_buckets = &(this->memorySizes)._M_h._M_single_bucket;
  (this->memorySizes)._M_h._M_bucket_count = 1;
  (this->memorySizes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->memorySizes)._M_h._M_element_count = 0;
  (this->memorySizes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->memorySizes)._M_h._M_rehash_policy._M_next_resize,0,0xd8);
  this->externalInterface = externalInterface;
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::_Rb_tree(&(this->linkedInstances)._M_t,&linkedInstances_->_M_t);
  return;
}

Assistant:

ModuleRunnerBase(
    Module& wasm,
    ExternalInterface* externalInterface,
    std::map<Name, std::shared_ptr<SubType>> linkedInstances_ = {})
    : ExpressionRunner<SubType>(&wasm), wasm(wasm),
      externalInterface(externalInterface), linkedInstances(linkedInstances_) {}